

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int push_promise(Curl_easy *data,connectdata *conn,nghttp2_push_promise *frame)

{
  HTTP *pHVar1;
  int iVar2;
  Curl_easy *local_68;
  Curl_easy *newhandle;
  size_t i;
  http_conn *httpc;
  undefined1 auStack_48 [4];
  CURLMcode rc;
  curl_pushheaders heads;
  HTTP *newstream;
  HTTP *stream;
  int rv;
  nghttp2_push_promise *frame_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (data->multi->push_cb == (curl_push_callback)0x0) {
    stream._4_4_ = 1;
  }
  else {
    local_68 = duphandle(data);
    if (local_68 == (Curl_easy *)0x0) {
      Curl_infof(data,"failed to duplicate handle");
      stream._4_4_ = 1;
    }
    else {
      pHVar1 = (data->req).p.http;
      _auStack_48 = data;
      heads.data = (Curl_easy *)frame;
      if (pHVar1 == (HTTP *)0x0) {
        Curl_failf(data,"Internal NULL stream");
        Curl_close(&local_68);
        stream._4_4_ = 1;
      }
      else {
        iVar2 = set_transfer_url(local_68,(curl_pushheaders *)auStack_48);
        if (iVar2 == 0) {
          Curl_set_in_callback(data,true);
          stream._4_4_ = (*data->multi->push_cb)
                                   (data,local_68,pHVar1->push_headers_used,
                                    (curl_pushheaders *)auStack_48,data->multi->push_userp);
          Curl_set_in_callback(data,false);
          for (newhandle = (Curl_easy *)0x0; newhandle < (Curl_easy *)pHVar1->push_headers_used;
              newhandle = (Curl_easy *)((long)&newhandle->magic + 1)) {
            (*Curl_cfree)(pHVar1->push_headers[(long)newhandle]);
          }
          (*Curl_cfree)(pHVar1->push_headers);
          pHVar1->push_headers = (char **)0x0;
          pHVar1->push_headers_used = 0;
          if (stream._4_4_ == 0) {
            heads.frame = (nghttp2_push_promise *)(local_68->req).p.http;
            ((HTTP *)heads.frame)->stream_id = frame->promised_stream_id;
            (local_68->req).maxdownload = -1;
            (local_68->req).size = -1;
            httpc._4_4_ = Curl_multi_add_perform(data->multi,local_68,conn);
            if (httpc._4_4_ == CURLM_OK) {
              i = (size_t)&conn->proto;
              iVar2 = nghttp2_session_set_stream_user_data
                                ((conn->proto).httpc.h2,frame->promised_stream_id,local_68);
              if (iVar2 == 0) {
                Curl_dyn_init((dynbuf *)&heads.frame[0xb].nvlen,0x20000);
                Curl_dyn_init((dynbuf *)&heads.frame[0xc].nva,0x20000);
                stream._4_4_ = 0;
              }
              else {
                Curl_infof(data,"failed to set user_data for stream %u",
                           (ulong)(uint)frame->promised_stream_id);
                stream._4_4_ = 1;
              }
            }
            else {
              Curl_infof(data,"failed to add handle to multi");
              http2_stream_free((local_68->req).p.http);
              (local_68->req).p.file = (FILEPROTO *)0x0;
              Curl_close(&local_68);
              stream._4_4_ = 1;
            }
          }
          else {
            http2_stream_free((local_68->req).p.http);
            (local_68->req).p.file = (FILEPROTO *)0x0;
            Curl_close(&local_68);
          }
        }
        else {
          Curl_close(&local_68);
          stream._4_4_ = 1;
        }
      }
    }
  }
  return stream._4_4_;
}

Assistant:

static int push_promise(struct Curl_easy *data,
                        struct connectdata *conn,
                        const nghttp2_push_promise *frame)
{
  int rv; /* one of the CURL_PUSH_* defines */
  H2BUGF(infof(data, "PUSH_PROMISE received, stream %u",
               frame->promised_stream_id));
  if(data->multi->push_cb) {
    struct HTTP *stream;
    struct HTTP *newstream;
    struct curl_pushheaders heads;
    CURLMcode rc;
    struct http_conn *httpc;
    size_t i;
    /* clone the parent */
    struct Curl_easy *newhandle = duphandle(data);
    if(!newhandle) {
      infof(data, "failed to duplicate handle");
      rv = CURL_PUSH_DENY; /* FAIL HARD */
      goto fail;
    }

    heads.data = data;
    heads.frame = frame;
    /* ask the application */
    H2BUGF(infof(data, "Got PUSH_PROMISE, ask application"));

    stream = data->req.p.http;
    if(!stream) {
      failf(data, "Internal NULL stream");
      (void)Curl_close(&newhandle);
      rv = CURL_PUSH_DENY;
      goto fail;
    }

    rv = set_transfer_url(newhandle, &heads);
    if(rv) {
      (void)Curl_close(&newhandle);
      rv = CURL_PUSH_DENY;
      goto fail;
    }

    Curl_set_in_callback(data, true);
    rv = data->multi->push_cb(data, newhandle,
                              stream->push_headers_used, &heads,
                              data->multi->push_userp);
    Curl_set_in_callback(data, false);

    /* free the headers again */
    for(i = 0; i<stream->push_headers_used; i++)
      free(stream->push_headers[i]);
    free(stream->push_headers);
    stream->push_headers = NULL;
    stream->push_headers_used = 0;

    if(rv) {
      DEBUGASSERT((rv > CURL_PUSH_OK) && (rv <= CURL_PUSH_ERROROUT));
      /* denied, kill off the new handle again */
      http2_stream_free(newhandle->req.p.http);
      newhandle->req.p.http = NULL;
      (void)Curl_close(&newhandle);
      goto fail;
    }

    newstream = newhandle->req.p.http;
    newstream->stream_id = frame->promised_stream_id;
    newhandle->req.maxdownload = -1;
    newhandle->req.size = -1;

    /* approved, add to the multi handle and immediately switch to PERFORM
       state with the given connection !*/
    rc = Curl_multi_add_perform(data->multi, newhandle, conn);
    if(rc) {
      infof(data, "failed to add handle to multi");
      http2_stream_free(newhandle->req.p.http);
      newhandle->req.p.http = NULL;
      Curl_close(&newhandle);
      rv = CURL_PUSH_DENY;
      goto fail;
    }

    httpc = &conn->proto.httpc;
    rv = nghttp2_session_set_stream_user_data(httpc->h2,
                                              frame->promised_stream_id,
                                              newhandle);
    if(rv) {
      infof(data, "failed to set user_data for stream %u",
            frame->promised_stream_id);
      DEBUGASSERT(0);
      rv = CURL_PUSH_DENY;
      goto fail;
    }
    Curl_dyn_init(&newstream->header_recvbuf, DYN_H2_HEADERS);
    Curl_dyn_init(&newstream->trailer_recvbuf, DYN_H2_TRAILERS);
  }
  else {
    H2BUGF(infof(data, "Got PUSH_PROMISE, ignore it"));
    rv = CURL_PUSH_DENY;
  }
  fail:
  return rv;
}